

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall Player::~Player(Player *this)

{
  vector<Map::Country_*,_std::allocator<Map::Country_*>_> *pvVar1;
  pointer ppCVar2;
  Hand *this_00;
  DiceRoller *this_01;
  list<Observer_*,_std::allocator<Observer_*>_> *plVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  
  pvVar1 = this->pOwnedCountries;
  if ((pvVar1 != (vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)0x0) &&
     (ppCVar2 = (pvVar1->super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>).
                _M_impl.super__Vector_impl_data._M_start, ppCVar2 != (pointer)0x0)) {
    operator_delete(ppCVar2,(long)(pvVar1->
                                  super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>
                                  )._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)ppCVar2);
  }
  operator_delete(pvVar1,0x18);
  this_00 = this->pCards;
  if (this_00 != (Hand *)0x0) {
    Hand::~Hand(this_00);
  }
  operator_delete(this_00,8);
  this_01 = this->pDiceRoller;
  if (this_01 != (DiceRoller *)0x0) {
    DiceRoller::~DiceRoller(this_01);
  }
  operator_delete(this_01,0x10);
  operator_delete(this->pPlayerId,4);
  plVar3 = this->pObservers;
  if (plVar3 != (list<Observer_*,_std::allocator<Observer_*>_> *)0x0) {
    p_Var5 = (plVar3->super__List_base<Observer_*,_std::allocator<Observer_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    while (p_Var5 != (_List_node_base *)plVar3) {
      p_Var4 = (((_List_base<Observer_*,_std::allocator<Observer_*>_> *)&p_Var5->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next;
      operator_delete(p_Var5,0x18);
      p_Var5 = p_Var4;
    }
  }
  operator_delete(plVar3,0x18);
  operator_delete(this->currentState,4);
  if (this->strategy == (PlayerStrategy *)0x0) {
    return;
  }
  (*this->strategy->_vptr_PlayerStrategy[7])();
  return;
}

Assistant:

Player::~Player() {
    delete pOwnedCountries;
    delete pCards;
    delete pDiceRoller;
    delete pPlayerId;
    delete pObservers;
    delete currentState;
    delete strategy;
}